

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_predictor.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue<false>
          (MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  Scalar_conflict1 *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong *puVar5;
  ulong uVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar7;
  long lVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  VectorD<unsigned_long,_2> *src_vector;
  undefined4 extraout_var_05;
  VectorD<long,_2> *this_00;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *in_RDI;
  int i_1;
  int i;
  int data_offset;
  bool orientation;
  Vec2 predicted_uv;
  uint64_t norm_squared;
  Vec2 cx_uv;
  uint64_t cx_norm2_squared;
  Vec3 x_pos;
  int64_t pn_absmax_element;
  Vec2 x_uv;
  int64_t pn_uv_absmax_element;
  int64_t n_uv_absmax_element;
  Vec2 pn_uv;
  int64_t cn_dot_pn;
  Vec3 cn;
  uint64_t pn_norm2_squared;
  Vec3 pn;
  Vec3 prev_pos;
  Vec3 next_pos;
  Vec3 tip_pos;
  Vec2 p_uv;
  Vec2 n_uv;
  int prev_vert_id;
  int next_vert_id;
  int prev_data_id;
  int next_data_id;
  CornerIndex prev_corner_id;
  CornerIndex next_corner_id;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  CornerTable *in_stack_fffffffffffffcb8;
  Self *in_stack_fffffffffffffcc0;
  VectorD<unsigned_long,_2> *this_01;
  Self *in_stack_fffffffffffffcc8;
  VectorD<unsigned_long,_2> *c0;
  VectorD<long,_3> *in_stack_fffffffffffffcd0;
  Self *o;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  int local_318;
  int local_314;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffcf0;
  reference local_260;
  byte local_249;
  uint64_t local_238;
  undefined8 local_230;
  undefined8 local_228;
  uint64_t local_220;
  long local_218;
  undefined8 local_210;
  undefined8 local_208;
  Scalar_conflict1 local_1e8;
  ulong local_1e0;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  ulong local_160;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  Self *local_110;
  VectorD<unsigned_long,_2> *local_f8;
  ulong local_d8;
  uint local_4c;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_48;
  uint local_44;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  value_type local_30;
  undefined4 local_2c;
  uint local_28;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  long local_18;
  undefined4 local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_ESI;
  MeshPredictionSchemeData<draco::CornerTable>::corner_table(&in_RDI->mesh_data_);
  local_24 = local_8;
  local_20 = (uint)CornerTable::Next(in_stack_fffffffffffffcb8,
                                     (CornerIndex)(uint)in_stack_fffffffffffffcc0);
  MeshPredictionSchemeData<draco::CornerTable>::corner_table(&in_RDI->mesh_data_);
  local_2c = local_8;
  local_28 = (uint)CornerTable::Previous
                             (in_stack_fffffffffffffcb8,(CornerIndex)(uint)in_stack_fffffffffffffcc0
                             );
  MeshPredictionSchemeData<draco::CornerTable>::corner_table(&in_RDI->mesh_data_);
  local_44 = local_20;
  local_40.value_ =
       (uint)CornerTable::Vertex(in_stack_fffffffffffffcb8,(uint)in_stack_fffffffffffffcc0);
  local_38 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_40);
  MeshPredictionSchemeData<draco::CornerTable>::corner_table(&in_RDI->mesh_data_);
  local_4c = local_28;
  local_48.value_ =
       (uint)CornerTable::Vertex(in_stack_fffffffffffffcb8,(uint)in_stack_fffffffffffffcc0);
  local_3c = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
  MeshPredictionSchemeData<draco::CornerTable>::vertex_to_data_map(&in_RDI->mesh_data_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::at
                     (in_stack_fffffffffffffcb0,
                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_30 = *pvVar3;
  MeshPredictionSchemeData<draco::CornerTable>::vertex_to_data_map(&in_RDI->mesh_data_);
  pvVar3 = std::vector<int,_std::allocator<int>_>::at
                     (in_stack_fffffffffffffcb0,
                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_34 = *pvVar3;
  if ((local_34 < local_1c) && (local_30 < local_1c)) {
    GetTexCoordForEntryId
              (in_RDI,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (int *)in_stack_fffffffffffffcc8);
    GetTexCoordForEntryId
              (in_RDI,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
               (int *)in_stack_fffffffffffffcc8);
    bVar1 = VectorD<long,_2>::operator==
                      ((VectorD<long,_2> *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    if (bVar1) {
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      in_RDI->predicted_value_[0] = (int)*pSVar4;
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      in_RDI->predicted_value_[1] = (int)*pSVar4;
      return true;
    }
    GetPositionForEntryId(in_RDI,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    GetPositionForEntryId(in_RDI,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    GetPositionForEntryId(in_RDI,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
    VectorD<long,_3>::operator-((VectorD<long,_3> *)in_RDI,in_stack_fffffffffffffcd0);
    local_d8 = VectorD<long,_3>::SquaredNorm((VectorD<long,_3> *)0x218f6f);
    if (local_d8 != 0) {
      VectorD<long,_3>::operator-((VectorD<long,_3> *)in_RDI,in_stack_fffffffffffffcd0);
      local_f8 = (VectorD<unsigned_long,_2> *)
                 VectorD<long,_3>::Dot(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      VectorD<long,_2>::operator-((VectorD<long,_2> *)in_RDI,(Self *)in_stack_fffffffffffffcd0);
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_118 = CONCAT44(extraout_var,iVar2);
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_120 = CONCAT44(extraout_var_00,iVar2);
      puVar5 = (ulong *)std::max<long>(&local_118,&local_120);
      o = (Self *)*puVar5;
      local_110 = o;
      uVar6 = std::numeric_limits<long>::max();
      if ((Self *)(uVar6 / local_d8) < o) {
        return false;
      }
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_130 = CONCAT44(extraout_var_01,iVar2);
      pSVar4 = VectorD<long,_2>::operator[]
                         ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_138 = CONCAT44(extraout_var_02,iVar2);
      plVar7 = std::max<long>(&local_130,&local_138);
      local_128 = *plVar7;
      c0 = local_f8;
      lVar8 = std::numeric_limits<long>::max();
      if (lVar8 / local_128 < (long)c0) {
        return false;
      }
      local_160 = local_d8;
      VectorD<long,_2>::operator*((VectorD<long,_2> *)in_RDI,(Scalar_conflict1 *)o);
      draco::operator*((long *)in_stack_fffffffffffffcb8,
                       (VectorD<long,_2> *)in_stack_fffffffffffffcb0);
      VectorD<long,_2>::operator+((VectorD<long,_2> *)in_RDI,(Self *)o);
      pSVar4 = VectorD<long,_3>::operator[]
                         ((VectorD<long,_3> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_180 = CONCAT44(extraout_var_03,iVar2);
      pSVar4 = VectorD<long,_3>::operator[]
                         ((VectorD<long,_3> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_188 = CONCAT44(extraout_var_04,iVar2);
      src_vector = (VectorD<unsigned_long,_2> *)std::max<long>(&local_180,&local_188);
      pSVar4 = VectorD<long,_3>::operator[]
                         ((VectorD<long,_3> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      iVar2 = std::abs((int)*pSVar4);
      local_190 = CONCAT44(extraout_var_05,iVar2);
      plVar7 = std::max<long>((long *)src_vector,&local_190);
      local_178 = *plVar7;
      this_01 = local_f8;
      lVar8 = std::numeric_limits<long>::max();
      if (lVar8 / local_178 < (long)this_01) {
        return false;
      }
      draco::operator*((long *)src_vector,(VectorD<long,_3> *)in_stack_fffffffffffffcb0);
      local_1e0 = local_d8;
      VectorD<long,_3>::operator/((VectorD<long,_3> *)in_RDI,(Scalar_conflict1 *)o);
      VectorD<long,_3>::operator+((VectorD<long,_3> *)in_RDI,o);
      VectorD<long,_3>::operator-((VectorD<long,_3> *)in_RDI,o);
      local_1e8 = VectorD<long,_3>::SquaredNorm((VectorD<long,_3> *)0x2192d5);
      this_00 = (VectorD<long,_2> *)
                VectorD<long,_2>::operator[]
                          ((VectorD<long,_2> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
      pSVar4 = VectorD<long,_2>::operator[](this_00,in_stack_fffffffffffffcac);
      local_218 = -*pSVar4;
      VectorD<long,_2>::VectorD
                ((VectorD<long,_2> *)o,(Scalar_conflict1 *)c0,(Scalar_conflict1 *)this_01);
      local_238 = IntSqrt(local_1e8 * local_d8);
      local_220 = local_238;
      VectorD<long,_2>::operator*((VectorD<long,_2> *)in_RDI,(Scalar_conflict1 *)o);
      local_210 = local_230;
      local_208 = local_228;
      VectorD<long,_2>::VectorD(this_00);
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_fffffffffffffcf0);
      if (!bVar1) {
        local_260 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)
                               CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
        local_249 = std::_Bit_reference::operator_cast_to_bool(&local_260);
        std::vector<bool,_std::allocator<bool>_>::pop_back
                  ((vector<bool,_std::allocator<bool>_> *)0x219408);
        if ((local_249 & 1) == 0) {
          VectorD<unsigned_long,2>::VectorD<long,2>(this_01,(VectorD<long,_2> *)src_vector);
          VectorD<unsigned_long,2>::VectorD<long,2>(this_01,(VectorD<long,_2> *)src_vector);
          VectorD<unsigned_long,_2>::operator-((VectorD<unsigned_long,_2> *)in_RDI,(Self *)o);
          VectorD<long,2>::VectorD<unsigned_long,2>((VectorD<long,_2> *)this_01,src_vector);
          VectorD<long,_2>::operator/((VectorD<long,_2> *)in_RDI,(Scalar_conflict1 *)o);
        }
        else {
          VectorD<unsigned_long,2>::VectorD<long,2>(this_01,(VectorD<long,_2> *)src_vector);
          VectorD<unsigned_long,2>::VectorD<long,2>(this_01,(VectorD<long,_2> *)src_vector);
          VectorD<unsigned_long,_2>::operator+((VectorD<unsigned_long,_2> *)in_RDI,(Self *)o);
          VectorD<long,2>::VectorD<unsigned_long,2>((VectorD<long,_2> *)this_01,src_vector);
          VectorD<long,_2>::operator/((VectorD<long,_2> *)in_RDI,(Scalar_conflict1 *)o);
        }
        pSVar4 = VectorD<long,_2>::operator[](this_00,in_stack_fffffffffffffcac);
        in_RDI->predicted_value_[0] = (int)*pSVar4;
        pSVar4 = VectorD<long,_2>::operator[](this_00,in_stack_fffffffffffffcac);
        in_RDI->predicted_value_[1] = (int)*pSVar4;
        return true;
      }
      return false;
    }
  }
  if (local_30 < local_1c) {
    local_314 = local_30 << 1;
  }
  else {
    if (local_1c < 1) {
      for (local_318 = 0; local_318 < 2; local_318 = local_318 + 1) {
        in_RDI->predicted_value_[local_318] = 0;
      }
      return true;
    }
    local_314 = (local_1c + -1) * 2;
  }
  for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
    in_RDI->predicted_value_[iVar2] = *(int *)(local_18 + (long)(local_314 + iVar2) * 4);
  }
  return true;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortablePredictor<
    DataTypeT, MeshDataT>::ComputePredictedValue(CornerIndex corner_id,
                                                 const DataTypeT *data,
                                                 int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id = mesh_data_.corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      mesh_data_.corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id = mesh_data_.corner_table()->Vertex(next_corner_id).value();
  prev_vert_id = mesh_data_.corner_table()->Vertex(prev_corner_id).value();

  next_data_id = mesh_data_.vertex_to_data_map()->at(next_vert_id);
  prev_data_id = mesh_data_.vertex_to_data_map()->at(prev_vert_id);

  typedef VectorD<int64_t, 2> Vec2;
  typedef VectorD<int64_t, 3> Vec3;
  typedef VectorD<uint64_t, 2> Vec2u;

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vec2 n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vec2 p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      predicted_value_[0] = p_uv[0];
      predicted_value_[1] = p_uv[1];
      return true;
    }

    // Get positions at all corners.
    const Vec3 tip_pos = GetPositionForEntryId(data_id);
    const Vec3 next_pos = GetPositionForEntryId(next_data_id);
    const Vec3 prev_pos = GetPositionForEntryId(prev_data_id);
    // We use the positions of the above triangle to predict the texture
    // coordinate on the tip corner C.
    // To convert the triangle into the UV coordinate system we first compute
    // position X on the vector |prev_pos - next_pos| that is the projection of
    // point C onto vector |prev_pos - next_pos|:
    //
    //              C
    //             /.  \
    //            / .     \
    //           /  .        \
    //          N---X----------P
    //
    // Where next_pos is point (N), prev_pos is point (P) and tip_pos is the
    // position of predicted coordinate (C).
    //
    const Vec3 pn = prev_pos - next_pos;
    const uint64_t pn_norm2_squared = pn.SquaredNorm();
    if (pn_norm2_squared != 0) {
      // Compute the projection of C onto PN by computing dot product of CN with
      // PN and normalizing it by length of PN. This gives us a factor |s| where
      // |s = PN.Dot(CN) / PN.SquaredNorm2()|. This factor can be used to
      // compute X in UV space |X_UV| as |X_UV = N_UV + s * PN_UV|.
      const Vec3 cn = tip_pos - next_pos;
      const int64_t cn_dot_pn = pn.Dot(cn);

      const Vec2 pn_uv = p_uv - n_uv;
      // Because we perform all computations with integers, we don't explicitly
      // compute the normalized factor |s|, but rather we perform all operations
      // over UV vectors in a non-normalized coordinate system scaled with a
      // scaling factor |pn_norm2_squared|:
      //
      //      x_uv = X_UV * PN.Norm2Squared()
      //
      const int64_t n_uv_absmax_element =
          std::max(std::abs(n_uv[0]), std::abs(n_uv[1]));
      if (n_uv_absmax_element >
          std::numeric_limits<int64_t>::max() / pn_norm2_squared) {
        // Return false if the below multiplication would overflow.
        return false;
      }
      const int64_t pn_uv_absmax_element =
          std::max(std::abs(pn_uv[0]), std::abs(pn_uv[1]));
      if (cn_dot_pn >
          std::numeric_limits<int64_t>::max() / pn_uv_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }
      const Vec2 x_uv = n_uv * pn_norm2_squared + (cn_dot_pn * pn_uv);
      const int64_t pn_absmax_element =
          std::max(std::max(std::abs(pn[0]), std::abs(pn[1])), std::abs(pn[2]));
      if (cn_dot_pn > std::numeric_limits<int64_t>::max() / pn_absmax_element) {
        // Return false if squared length calculation would overflow.
        return false;
      }

      // Compute squared length of vector CX in position coordinate system:
      const Vec3 x_pos = next_pos + (cn_dot_pn * pn) / pn_norm2_squared;
      const uint64_t cx_norm2_squared = (tip_pos - x_pos).SquaredNorm();

      // Compute vector CX_UV in the uv space by rotating vector PN_UV by 90
      // degrees and scaling it with factor CX.Norm2() / PN.Norm2():
      //
      //     CX_UV = (CX.Norm2() / PN.Norm2()) * Rot(PN_UV)
      //
      // To preserve precision, we perform all operations in scaled space as
      // explained above, so we want the final vector to be:
      //
      //     cx_uv = CX_UV * PN.Norm2Squared()
      //
      // We can then rewrite the formula as:
      //
      //     cx_uv = CX.Norm2() * PN.Norm2() * Rot(PN_UV)
      //
      Vec2 cx_uv(pn_uv[1], -pn_uv[0]);  // Rotated PN_UV.
      // Compute CX.Norm2() * PN.Norm2()
      const uint64_t norm_squared =
          IntSqrt(cx_norm2_squared * pn_norm2_squared);
      // Final cx_uv in the scaled coordinate space.
      cx_uv = cx_uv * norm_squared;

      // Predicted uv coordinate is then computed by either adding or
      // subtracting CX_UV to/from X_UV.
      Vec2 predicted_uv;
      if (is_encoder_t) {
        // When encoding, compute both possible vectors and determine which one
        // results in a better prediction.
        // Both vectors need to be transformed back from the scaled space to
        // the real UV coordinate space.
        const Vec2 predicted_uv_0((x_uv + cx_uv) / pn_norm2_squared);
        const Vec2 predicted_uv_1((x_uv - cx_uv) / pn_norm2_squared);
        const Vec2 c_uv = GetTexCoordForEntryId(data_id, data);
        if ((c_uv - predicted_uv_0).SquaredNorm() <
            (c_uv - predicted_uv_1).SquaredNorm()) {
          predicted_uv = predicted_uv_0;
          orientations_.push_back(true);
        } else {
          predicted_uv = predicted_uv_1;
          orientations_.push_back(false);
        }
      } else {
        // When decoding the data, we already know which orientation to use.
        if (orientations_.empty()) {
          return false;
        }
        const bool orientation = orientations_.back();
        orientations_.pop_back();
        // Perform operations in unsigned type to avoid signed integer overflow.
        // Note that the result will be the same (for non-overflowing values).
        if (orientation) {
          predicted_uv = Vec2(Vec2u(x_uv) + Vec2u(cx_uv)) / pn_norm2_squared;
        } else {
          predicted_uv = Vec2(Vec2u(x_uv) - Vec2u(cx_uv)) / pn_norm2_squared;
        }
      }
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
      return true;
    }
  }
  // Else we don't have available textures on both corners or the position data
  // is invalid. For such cases we can't use positions for predicting the uv
  // value and we resort to delta coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * kNumComponents;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * kNumComponents;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * kNumComponents;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < kNumComponents; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < kNumComponents; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}